

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

pair<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_bool>
* __thiscall
pstore::json::details::string_matcher<json_out_callbacks>::consume
          (pair<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_bool>
           *__return_storage_ptr__,string_matcher<json_out_callbacks> *this,
          parser<json_out_callbacks> *parser,maybe<char,_void> *ch)

{
  state sVar1;
  uint hex;
  bool bVar2;
  uint8_t *puVar3;
  char32_t *pcVar4;
  tuple<unsigned_int,_pstore::json::details::string_matcher<json_out_callbacks>::state> *ptVar5;
  int line;
  char *str;
  error_code eVar6;
  maybe<char32_t,_void> code_point;
  tuple<pstore::json::details::string_matcher<json_out_callbacks>::state,_std::error_code>
  normal_resl;
  tuple<pstore::json::details::string_matcher<json_out_callbacks>::state,_pstore::json::error_code>
  escape_resl;
  maybe<char32_t,_void> local_60;
  tuple<pstore::json::details::string_matcher<json_out_callbacks>::state,_std::error_code> local_58;
  maybe<std::tuple<unsigned_int,_pstore::json::details::string_matcher<json_out_callbacks>::state>,_void>
  local_3c;
  
  if (ch->valid_ == false) {
    local_58.
    super__Tuple_impl<0UL,_pstore::json::details::string_matcher<json_out_callbacks>::state,_std::error_code>
    .super__Tuple_impl<1UL,_std::error_code>.super__Head_base<1UL,_std::error_code,_false>.
    _M_head_impl._M_cat = get_error_category();
    local_58.
    super__Tuple_impl<0UL,_pstore::json::details::string_matcher<json_out_callbacks>::state,_std::error_code>
    .super__Tuple_impl<1UL,_std::error_code>.super__Head_base<1UL,_std::error_code,_false>.
    _M_head_impl._M_value = 2;
    goto LAB_001314d5;
  }
  puVar3 = (uint8_t *)maybe<char,_void>::operator->(ch);
  utf::utf8_decoder::get(&local_60,&this->decoder_,*puVar3);
  if (local_60.valid_ != true) goto switchD_00131490_default;
  sVar1 = (this->super_matcher<json_out_callbacks>).state_;
  switch(sVar1) {
  case done_state:
    line = 0x476;
    str = "false";
LAB_00131643:
    assert_failed(str,
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                  ,line);
  case start_state:
    pcVar4 = maybe<char32_t,_void>::operator->(&local_60);
    if (*pcVar4 == L'\"') {
      if ((this->app_).high_surrogate_ == L'\0') {
        (this->super_matcher<json_out_callbacks>).state_ = 3;
        goto switchD_00131490_default;
      }
      line = 0x44a;
      str = "!app_.has_high_surrogate ()";
      goto LAB_00131643;
    }
    local_58.
    super__Tuple_impl<0UL,_pstore::json::details::string_matcher<json_out_callbacks>::state,_std::error_code>
    .super__Tuple_impl<1UL,_std::error_code>.super__Head_base<1UL,_std::error_code,_false>.
    _M_head_impl._M_cat = get_error_category();
    local_58.
    super__Tuple_impl<0UL,_pstore::json::details::string_matcher<json_out_callbacks>::state,_std::error_code>
    .super__Tuple_impl<1UL,_std::error_code>.super__Head_base<1UL,_std::error_code,_false>.
    _M_head_impl._M_value = 8;
    break;
  case normal_char_state:
    pcVar4 = maybe<char32_t,_void>::operator->(&local_60);
    consume_normal_state(&local_58,this,parser,*pcVar4,&this->app_);
    (this->super_matcher<json_out_callbacks>).state_ =
         local_58.
         super__Tuple_impl<0UL,_pstore::json::details::string_matcher<json_out_callbacks>::state,_std::error_code>
         .
         super__Head_base<0UL,_pstore::json::details::string_matcher<json_out_callbacks>::state,_false>
         ._M_head_impl;
    break;
  case escape_state:
    pcVar4 = maybe<char32_t,_void>::operator->(&local_60);
    consume_escape_state((string_matcher<json_out_callbacks> *)&local_3c,*pcVar4,&this->app_);
    (this->super_matcher<json_out_callbacks>).state_ = (int)local_3c.storage_.__align;
    eVar6 = make_error_code(local_3c._0_4_);
    local_58.
    super__Tuple_impl<0UL,_pstore::json::details::string_matcher<json_out_callbacks>::state,_std::error_code>
    .super__Tuple_impl<1UL,_std::error_code>.super__Head_base<1UL,_std::error_code,_false>.
    _M_head_impl._M_cat = eVar6._M_cat;
    local_58.
    super__Tuple_impl<0UL,_pstore::json::details::string_matcher<json_out_callbacks>::state,_std::error_code>
    .super__Tuple_impl<1UL,_std::error_code>.super__Head_base<1UL,_std::error_code,_false>.
    _M_head_impl._M_value = eVar6._M_value;
    break;
  case hex1_state:
    this->hex_ = 0;
  case hex2_state:
  case hex3_state:
  case hex4_state:
    hex = this->hex_;
    pcVar4 = maybe<char32_t,_void>::operator->(&local_60);
    consume_hex_state(&local_3c,hex,sVar1,*pcVar4);
    if (local_3c.valid_ == false) {
      local_58.
      super__Tuple_impl<0UL,_pstore::json::details::string_matcher<json_out_callbacks>::state,_std::error_code>
      .super__Tuple_impl<1UL,_std::error_code>.super__Head_base<1UL,_std::error_code,_false>.
      _M_head_impl._M_cat = get_error_category();
      local_58.
      super__Tuple_impl<0UL,_pstore::json::details::string_matcher<json_out_callbacks>::state,_std::error_code>
      .super__Tuple_impl<1UL,_std::error_code>.super__Head_base<1UL,_std::error_code,_false>.
      _M_head_impl._M_value = 10;
    }
    else {
      ptVar5 = maybe<std::tuple<unsigned_int,_pstore::json::details::string_matcher<json_out_callbacks>::state>,_void>
               ::operator->(&local_3c);
      this->hex_ = (ptVar5->
                   super__Tuple_impl<0UL,_unsigned_int,_pstore::json::details::string_matcher<json_out_callbacks>::state>
                   ).super__Head_base<0UL,_unsigned_int,_false>._M_head_impl;
      ptVar5 = maybe<std::tuple<unsigned_int,_pstore::json::details::string_matcher<json_out_callbacks>::state>,_void>
               ::operator->(&local_3c);
      sVar1 = (ptVar5->
              super__Tuple_impl<0UL,_unsigned_int,_pstore::json::details::string_matcher<json_out_callbacks>::state>
              ).
              super__Tuple_impl<1UL,_pstore::json::details::string_matcher<json_out_callbacks>::state>
              .
              super__Head_base<1UL,_pstore::json::details::string_matcher<json_out_callbacks>::state,_false>
              ._M_head_impl;
      (this->super_matcher<json_out_callbacks>).state_ = sVar1;
      if ((sVar1 != normal_char_state) ||
         (bVar2 = appender::append16(&this->app_,(char16_t)this->hex_), bVar2))
      goto switchD_00131490_default;
      local_58.
      super__Tuple_impl<0UL,_pstore::json::details::string_matcher<json_out_callbacks>::state,_std::error_code>
      .super__Tuple_impl<1UL,_std::error_code>.super__Head_base<1UL,_std::error_code,_false>.
      _M_head_impl._M_cat = get_error_category();
      local_58.
      super__Tuple_impl<0UL,_pstore::json::details::string_matcher<json_out_callbacks>::state,_std::error_code>
      .super__Tuple_impl<1UL,_std::error_code>.super__Head_base<1UL,_std::error_code,_false>.
      _M_head_impl._M_value = 0xd;
    }
    break;
  default:
    goto switchD_00131490_default;
  }
LAB_001314d5:
  matcher<json_out_callbacks>::set_error
            (&this->super_matcher<json_out_callbacks>,parser,(error_code *)&local_58);
switchD_00131490_default:
  *(undefined8 *)
   &(__return_storage_ptr__->first)._M_t.
    super___uniq_ptr_impl<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
       = 1;
  (__return_storage_ptr__->first)._M_t.
  super___uniq_ptr_impl<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
  .super__Head_base<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_false>._M_head_impl =
       (matcher<json_out_callbacks> *)0x0;
  __return_storage_ptr__->second = true;
  return __return_storage_ptr__;
}

Assistant:

std::pair<typename matcher<Callbacks>::pointer, bool>
            string_matcher<Callbacks>::consume (parser<Callbacks> & parser, maybe<char> ch) {
                if (!ch) {
                    this->set_error (parser, error_code::expected_close_quote);
                    return {nullptr, true};
                }

                if (maybe<char32_t> const code_point =
                        decoder_.get (static_cast<std::uint8_t> (*ch))) {
                    switch (this->get_state ()) {
                    // Matches the opening quote.
                    case start_state:
                        if (*code_point == '"') {
                            PSTORE_ASSERT (!app_.has_high_surrogate ());
                            this->set_state (normal_char_state);
                        } else {
                            this->set_error (parser, error_code::expected_token);
                        }
                        break;
                    case normal_char_state: {
                        auto const normal_resl =
                            string_matcher::consume_normal_state (parser, *code_point, app_);
                        this->set_state (std::get<0> (normal_resl));
                        this->set_error (parser, std::get<std::error_code> (normal_resl));
                    } break;

                    case escape_state: {
                        auto const escape_resl =
                            string_matcher::consume_escape_state (*code_point, app_);
                        this->set_state (std::get<0> (escape_resl));
                        this->set_error (parser, std::get<1> (escape_resl));
                    } break;

                    case hex1_state: hex_ = 0; PSTORE_FALLTHROUGH;
                    case hex2_state:
                    case hex3_state:
                    case hex4_state: {
                        maybe<std::tuple<unsigned, state>> const hex_resl =
                            string_matcher::consume_hex_state (
                                hex_, static_cast<state> (this->get_state ()), *code_point);
                        if (!hex_resl) {
                            this->set_error (parser, error_code::invalid_hex_char);
                            break;
                        }
                        hex_ = std::get<0> (*hex_resl);
                        state const next_state = std::get<1> (*hex_resl);
                        this->set_state (next_state);
                        // We're done with the hex characters and are switching back to the "normal"
                        // state. The means that we can add the accumulated code-point (in hex_) to
                        // the string.
                        if (next_state == normal_char_state) {
                            if (!app_.append16 (static_cast<char16_t> (hex_))) {
                                this->set_error (parser, error_code::bad_unicode_code_point);
                            }
                        }
                    } break;

                    case done_state: PSTORE_ASSERT (false); break;
                    }
                }
                return {nullptr, true};
            }